

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::HasProperty_Internal<false>
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance,PropertyId propertyId,bool *noRedecl,PropertyValueInfo *info,
          bool *pDeclaredProperty,bool *pNonconfigurableProperty)

{
  byte bVar1;
  bool bVar2;
  uint32 index;
  BOOL BVar3;
  SimpleDictionaryPropertyDescriptor<int> *local_40;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *propertyRecord;
  
  if (propertyId == -1) {
    BVar3 = 0;
  }
  else {
    descriptor = (SimpleDictionaryPropertyDescriptor<int> *)
                 ScriptContext::GetPropertyName
                           ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr
                             )->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
    bVar2 = JsUtil::
            BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
            ::TryGetReference<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                        *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,&local_40);
    if (bVar2) {
      bVar1 = local_40->Attributes;
      BVar3 = 0;
      if ((bVar1 & 0x18) == 0) {
        if (0x3f < bVar1 && noRedecl != (bool *)0x0) {
          *noRedecl = true;
        }
        if (0x1f < bVar1 && pDeclaredProperty != (bool *)0x0) {
          *pDeclaredProperty = true;
        }
        if ((pNonconfigurableProperty != (bool *)0x0) && ((bVar1 & 2) == 0)) {
          *pNonconfigurableProperty = true;
        }
        BVar3 = 1;
        if ((info != (PropertyValueInfo *)0x0) && (local_40->propertyIndex != -1)) {
          SetPropertyValueInfo(this,info,&instance->super_RecyclableObject,local_40);
        }
      }
    }
    else {
      bVar2 = DynamicObject::HasObjectArray(instance);
      BVar3 = 0;
      if ((bVar2) && (*(char *)(descriptor + 2) == '\x01')) {
        index = PropertyRecord::GetNumericValue((PropertyRecord *)descriptor);
        BVar3 = DynamicTypeHandler::HasItem(&this->super_DynamicTypeHandler,instance,index);
      }
    }
  }
  return BVar3;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::HasProperty_Internal(DynamicObject* instance, PropertyId propertyId, bool *noRedecl, _Inout_opt_ PropertyValueInfo* info, bool *pDeclaredProperty, bool *pNonconfigurableProperty)
    {
        // HasProperty is called with NoProperty in JavascriptDispatch.cpp to for undeferral of the
        // deferred type system that DOM objects use.  Allow NoProperty for this reason, but only
        // here in HasProperty.
        if (propertyId == Constants::NoProperty)
        {
            return false;
        }

        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((descriptor->Attributes & PropertyDeleted) || (!allowLetConstGlobal && !descriptor->HasNonLetConstGlobal()))
            {
                return false;
            }
            if (noRedecl && descriptor->Attributes & PropertyNoRedecl)
            {
                *noRedecl = true;
            }
            if (pDeclaredProperty && descriptor->Attributes & (PropertyNoRedecl | PropertyDeclaredGlobal))
            {
                *pDeclaredProperty = true;
            }
            if (pNonconfigurableProperty && !(descriptor->Attributes & PropertyConfigurable))
            {
                *pNonconfigurableProperty = true;
            }
            if (info && descriptor->propertyIndex != NoSlots)
            {
                SetPropertyValueInfo(info, instance, descriptor);
            }
            return true;
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::HasItem(instance, propertyRecord->GetNumericValue());
        }

        return false;
    }